

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

VRCodeGraphIterator * __thiscall dg::vr::VRCodeGraph::begin(VRCodeGraph *this)

{
  bool bVar1;
  const_iterator begin;
  MappingIterator in_RSI;
  VRCodeGraphIterator *in_RDI;
  VRCodeGraphIterator *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::
          map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
          ::empty((map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
                   *)0x1c08cd);
  if (bVar1) {
    memset(in_RDI,0,0x68);
    VRCodeGraphIterator::VRCodeGraphIterator(this_00);
  }
  else {
    std::
    map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
    ::begin((map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
             *)in_RDI);
    begin = std::
            map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
            ::end((map<const_llvm::Function_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::vr::VRLocation_*>_>_>
                   *)in_RDI);
    VRCodeGraphIterator::VRCodeGraphIterator(this_00,(MappingIterator)begin._M_node,in_RSI);
  }
  return this_00;
}

Assistant:

VRCodeGraph::VRCodeGraphIterator VRCodeGraph::begin() const {
    return functionMapping.empty()
                   ? VRCodeGraphIterator()
                   : VRCodeGraphIterator(functionMapping.begin(),
                                         functionMapping.end());
}